

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O2

void duckdb_je_psset_stats_accum(psset_stats_t *dst,psset_stats_t *src)

{
  long lVar1;
  bool bVar2;
  
  psset_bin_stats_accum(dst->full_slabs,src->full_slabs);
  psset_bin_stats_accum(dst->full_slabs + 1,src->full_slabs + 1);
  psset_bin_stats_accum(dst->empty_slabs,src->empty_slabs);
  psset_bin_stats_accum(dst->empty_slabs + 1,src->empty_slabs + 1);
  lVar1 = 0x40;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    psset_bin_stats_accum((psset_bin_stats_t *)dst,(psset_bin_stats_t *)src);
    psset_bin_stats_accum(dst->nonfull_slabs[0] + 1,src->nonfull_slabs[0] + 1);
    dst = (psset_stats_t *)(dst->nonfull_slabs + 1);
    src = (psset_stats_t *)(src->nonfull_slabs + 1);
  }
  return;
}

Assistant:

void
psset_stats_accum(psset_stats_t *dst, psset_stats_t *src) {
	psset_bin_stats_accum(&dst->full_slabs[0], &src->full_slabs[0]);
	psset_bin_stats_accum(&dst->full_slabs[1], &src->full_slabs[1]);
	psset_bin_stats_accum(&dst->empty_slabs[0], &src->empty_slabs[0]);
	psset_bin_stats_accum(&dst->empty_slabs[1], &src->empty_slabs[1]);
	for (pszind_t i = 0; i < PSSET_NPSIZES; i++) {
		psset_bin_stats_accum(&dst->nonfull_slabs[i][0],
		    &src->nonfull_slabs[i][0]);
		psset_bin_stats_accum(&dst->nonfull_slabs[i][1],
		    &src->nonfull_slabs[i][1]);
	}
}